

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WFXMLScanner.cpp
# Opt level: O2

void __thiscall xercesc_4_0::WFXMLScanner::scanDocTypeDecl(WFXMLScanner *this)

{
  XMLCh XVar1;
  ReaderMgr *this_00;
  
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  XVar1 = ReaderMgr::skipUntilIn(this_00,L"[>");
  if (XVar1 == L'[') {
    ReaderMgr::skipPastChar(this_00,L']');
  }
  ReaderMgr::skipPastChar(this_00,L'>');
  return;
}

Assistant:

void WFXMLScanner::scanDocTypeDecl()
{
    // Just skips over it
    // REVISIT: Should we issue a warning
    static const XMLCh doctypeIE[] =
    {
        chOpenSquare, chCloseAngle, chNull
    };
    XMLCh nextCh = fReaderMgr.skipUntilIn(doctypeIE);

    if (nextCh == chOpenSquare)
        fReaderMgr.skipPastChar(chCloseSquare);

    fReaderMgr.skipPastChar(chCloseAngle);
}